

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O0

void __thiscall cmMacroHelperCommand::~cmMacroHelperCommand(cmMacroHelperCommand *this)

{
  cmMacroHelperCommand *this_local;
  
  ~cmMacroHelperCommand(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

~cmMacroHelperCommand() CM_OVERRIDE {}